

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
          (JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *this,
          vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *list)

{
  bool bVar1;
  PsbtMapData *in_RDI;
  PsbtMapData object;
  PsbtMapDataStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *__range3;
  PsbtMapDataStruct *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff48;
  vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
  *in_stack_ffffffffffffff50;
  PsbtMapData *in_stack_ffffffffffffff80;
  __normal_iterator<const_PsbtMapDataStruct_*,_std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (PsbtMapDataStruct *)
       ::std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::begin
                 (in_stack_ffffffffffffff38);
  ::std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::end
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)
             in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PsbtMapDataStruct_*,_std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_PsbtMapDataStruct_*,_std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_PsbtMapDataStruct_*,_std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>_>
    ::operator*(local_20);
    in_stack_ffffffffffffff38 = (PsbtMapDataStruct *)&stack0xffffffffffffff58;
    cfd::api::json::PsbtMapData::PsbtMapData(in_stack_ffffffffffffff80);
    cfd::api::json::PsbtMapData::ConvertFromStruct(in_RDI,in_stack_ffffffffffffff38);
    ::std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::
    push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    cfd::api::json::PsbtMapData::~PsbtMapData(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_PsbtMapDataStruct_*,_std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }